

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_StoCreateGateAdd(Vec_Mem_t *vTtMem,Vec_Wec_t *vTt2Match,Mio_Cell2_t *pCell,word uTruth,
                        int *pFans,int nFans,Vec_Wec_t *vProfs,Vec_Int_t *vStore,int fPinFilter,
                        int fPinPerm,int fPinQuick)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Vec_Int_t *p;
  int *pProf;
  ulong uVar8;
  ulong uVar9;
  Vec_Int_t *local_60;
  word uFunc;
  
  uVar8 = (ulong)((uint)uTruth & 1);
  uFunc = -uVar8 ^ uTruth;
  iVar1 = Vec_MemHashInsert(vTtMem,&uFunc);
  if (iVar1 == vTt2Match->nSize) {
    Vec_WecPushLevel(vTt2Match);
  }
  p = Vec_WecEntry(vTt2Match,iVar1);
  if (*(uint *)&pCell->field_0x10 >> 0x1c != nFans) {
    __assert_fail("nFans == (int)pCell->nFanins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                  ,0xc3,
                  "void Nf_StoCreateGateAdd(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, word, int *, int, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
                 );
  }
  for (uVar9 = 0; uVar5 = (uint)uVar8, (uint)nFans != uVar9; uVar9 = uVar9 + 1) {
    iVar2 = Abc_Lit2Var(pFans[uVar9]);
    iVar3 = Abc_LitIsCompl(pFans[uVar9]);
    iVar4 = Abc_Lit2Var(pFans[uVar9]);
    uVar8 = (ulong)(uVar5 & 0xffffff01 | ((int)uVar9 << ((char)iVar2 * '\x04' & 0x1fU)) << 8 |
                   ((iVar3 << ((byte)iVar4 & 0x1f)) * 2 | uVar5) & 0xfe);
  }
  if (fPinFilter == 0) {
    local_60 = (Vec_Int_t *)0x0;
  }
  else {
    if (vTt2Match->nSize != vProfs->nSize) {
      __assert_fail("Vec_WecSize(vTt2Match) == Vec_WecSize(vProfs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                    ,0xcd,
                    "void Nf_StoCreateGateAdd(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, word, int *, int, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
                   );
    }
    if (iVar1 == vTt2Match->nSize) {
      Vec_WecPushLevel(vProfs);
    }
    local_60 = Vec_WecEntry(vProfs,iVar1);
    iVar1 = p->nSize;
    if (iVar1 != local_60->nSize * 2) {
      __assert_fail("Vec_IntSize(vArray) == 2 * Vec_IntSize(vArrayProfs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                    ,0xd1,
                    "void Nf_StoCreateGateAdd(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, word, int *, int, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
                   );
    }
    iVar3 = 0;
    for (iVar2 = 1; iVar2 < iVar1; iVar2 = iVar2 + 2) {
      Vec_IntEntry(p,iVar2 + -1);
      iVar1 = Vec_IntEntry(p,iVar2);
      if ((char)uVar8 == (char)iVar1) {
        iVar1 = Vec_IntEntry(local_60,iVar3);
        pProf = Vec_IntEntryP(vStore,iVar1);
        iVar1 = Nf_StoCellIsDominated(pCell,pFans,pProf);
        if (iVar1 != 0) {
          return;
        }
      }
      iVar1 = p->nSize;
      iVar3 = iVar3 + 1;
    }
  }
  if (fPinPerm == 0) {
    if (fPinQuick == 0) {
      for (iVar1 = 1; iVar1 < p->nSize; iVar1 = iVar1 + 2) {
        uVar6 = Vec_IntEntry(p,iVar1 + -1);
        uVar7 = Vec_IntEntry(p,iVar1);
        if ((uVar6 == (*(uint *)&pCell->field_0x10 & 0x3ffffff)) && (((uVar7 ^ uVar5) & 0xfe) == 0))
        {
          return;
        }
      }
    }
    else {
      for (iVar1 = 1; iVar1 < p->nSize; iVar1 = iVar1 + 2) {
        uVar6 = Vec_IntEntry(p,iVar1 + -1);
        uVar7 = Vec_IntEntry(p,iVar1);
        if ((uVar6 == (*(uint *)&pCell->field_0x10 & 0x3ffffff)) &&
           (*(int *)((long)Abc_TtBitCount8 + (ulong)(uVar7 & 0xfe) * 2) ==
            Abc_TtBitCount8[(uint)(uVar8 >> 1) & 0x7f])) {
          return;
        }
      }
    }
  }
  Vec_IntPush(p,*(uint *)&pCell->field_0x10 & 0x3ffffff);
  Vec_IntPush(p,uVar5);
  if (fPinFilter != 0) {
    Vec_IntPush(local_60,vStore->nSize);
    Vec_IntPush(vStore,(int)pCell->AreaF);
    uVar9 = 0;
    uVar8 = (ulong)(uint)nFans;
    if (nFans < 1) {
      uVar8 = uVar9;
    }
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      uVar5 = Abc_Lit2Var(pFans[uVar9]);
      Vec_IntPush(vStore,pCell->iDelays[uVar5]);
    }
  }
  return;
}

Assistant:

void Nf_StoCreateGateAdd( Vec_Mem_t * vTtMem, Vec_Wec_t * vTt2Match, Mio_Cell2_t * pCell, word uTruth, int * pFans, int nFans, Vec_Wec_t * vProfs, Vec_Int_t * vStore, int fPinFilter, int fPinPerm, int fPinQuick )
{
    Vec_Int_t * vArray, * vArrayProfs = NULL;
    int i, k, GateId, Entry, fCompl = (int)(uTruth & 1);
    word uFunc = fCompl ? ~uTruth : uTruth;
    int iFunc = Vec_MemHashInsert( vTtMem, &uFunc );
    Nf_Cfg_t Mat = Nf_Int2Cfg(0);
    // get match array
    if ( iFunc == Vec_WecSize(vTt2Match) )
        Vec_WecPushLevel( vTt2Match );
    vArray = Vec_WecEntry( vTt2Match, iFunc );
    // create match
    Mat.fCompl = fCompl;
    assert( nFans == (int)pCell->nFanins );
    for ( i = 0; i < nFans; i++ )
    {
        Mat.Perm  |= (unsigned)(i << (Abc_Lit2Var(pFans[i]) << 2));
        Mat.Phase |= (unsigned)(Abc_LitIsCompl(pFans[i]) << Abc_Lit2Var(pFans[i]));
    }
    // check other profiles
    if ( fPinFilter )
    {
        // get profile array
        assert( Vec_WecSize(vTt2Match) == Vec_WecSize(vProfs) );
        if ( iFunc == Vec_WecSize(vProfs) )
            Vec_WecPushLevel( vProfs );
        vArrayProfs = Vec_WecEntry( vProfs, iFunc );
        assert( Vec_IntSize(vArray) == 2 * Vec_IntSize(vArrayProfs) );
        // skip dominated matches
        Vec_IntForEachEntryDouble( vArray, GateId, Entry, i )
            if ( Nf_Int2Cfg(Entry).Phase == Mat.Phase && Nf_Int2Cfg(Entry).fCompl == Mat.fCompl )
            {
                int Offset = Vec_IntEntry(vArrayProfs, i/2);
                int * pProf = Vec_IntEntryP(vStore, Offset);
                if ( Nf_StoCellIsDominated(pCell, pFans, pProf) )
                    return;
            }
    }
    // check pin permutation
    if ( !fPinPerm ) // do not use  pin-permutation (improves delay when pin-delays differ)
    {
        if ( fPinQuick ) // reduce the number of matches agressively
        {
            Vec_IntForEachEntryDouble( vArray, GateId, Entry, i )
                if ( GateId == (int)pCell->Id && Abc_TtBitCount8[Nf_Int2Cfg(Entry).Phase] == Abc_TtBitCount8[Mat.Phase] )
                    return;
        }
        else // reduce the number of matches less agressively
        {
            Vec_IntForEachEntryDouble( vArray, GateId, Entry, i )
                if ( GateId == (int)pCell->Id && Nf_Int2Cfg(Entry).Phase == Mat.Phase )
                    return;
        }
    }
    // save data and profile
    Vec_IntPush( vArray, pCell->Id );
    Vec_IntPush( vArray, Nf_Cfg2Int(Mat) );
    // add delay profile
    if ( fPinFilter )
    {
        Vec_IntPush( vArrayProfs, Vec_IntSize(vStore) );
        Vec_IntPush( vStore, Abc_Float2Int(pCell->AreaF) );
        for ( k = 0; k < nFans; k++ )
            Vec_IntPush( vStore, pCell->iDelays[Abc_Lit2Var(pFans[k])] );
    }
}